

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O2

int etdc_encode(etdc_table **table,uint *input,int size,uchar *output)

{
  long *plVar1;
  UT_hash_table *pUVar2;
  UT_hash_handle *pUVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  iVar4 = (int)output;
  uVar5 = (ulong)(uint)size;
  if (size < 1) {
    uVar5 = 0;
  }
  uVar8 = 0;
  do {
    if (uVar8 == uVar5) {
      return (int)output - iVar4;
    }
    if (*table != (etdc_table *)0x0) {
      uVar10 = *(char *)((long)input + uVar8 * 4 + 1) * 0x100 +
               *(char *)((long)input + uVar8 * 4 + 2) * 0x10000 +
               (uint)*(byte *)((long)input + uVar8 * 4 + 3) * 0x1000000 + (int)(char)input[uVar8] +
               0x112410d ^ 0x7f76d;
      uVar12 = uVar10 << 8 ^ 0x9f49bac6 - uVar10;
      uVar6 = uVar12 >> 0xd ^ (-0x112410d - uVar10) - uVar12;
      uVar13 = uVar6 >> 0xc ^ (uVar10 - uVar12) - uVar6;
      uVar10 = uVar13 << 0x10 ^ (uVar12 - uVar6) - uVar13;
      uVar12 = uVar10 >> 5 ^ (uVar6 - uVar13) - uVar10;
      uVar6 = uVar12 >> 3 ^ (uVar13 - uVar10) - uVar12;
      uVar10 = uVar6 << 10 ^ (uVar10 - uVar12) - uVar6;
      pUVar2 = ((*table)->hh).tbl;
      pUVar3 = pUVar2->buckets
               [pUVar2->num_buckets - 1 & (uVar10 >> 0xf ^ uVar12 - (uVar6 + uVar10))].hh_head;
      if (pUVar3 == (UT_hash_handle *)0x0) {
        lVar9 = 0;
      }
      else {
        lVar9 = (long)pUVar3 - pUVar2->hho;
      }
      while (lVar9 != 0) {
        if ((*(int *)(lVar9 + 0x48) == 4) && (**(uint **)(lVar9 + 0x40) == input[uVar8]))
        goto LAB_0010174d;
        plVar1 = (long *)(lVar9 + 0x38);
        lVar9 = 0;
        if (*plVar1 != 0) {
          lVar9 = *plVar1 - pUVar2->hho;
        }
      }
    }
    lVar9 = 0;
LAB_0010174d:
    iVar11 = *(int *)(lVar9 + 0x10);
    if (*(int *)(lVar9 + 0x10) < 1) {
      iVar11 = 0;
    }
    for (lVar7 = 0; iVar11 != (int)lVar7; lVar7 = lVar7 + 1) {
      output[lVar7] = *(uchar *)(lVar9 + 8 + lVar7);
    }
    uVar8 = uVar8 + 1;
    output = output + lVar7;
  } while( true );
}

Assistant:

int etdc_encode(struct etdc_table **table, unsigned int *input, int size, unsigned char *output) {
  int i,ts;
  struct etdc_table *e;
  int k;

  unsigned char *t;
  unsigned char *f;

  t = output;

  for (i = 0; i < size; i++) {
    HASH_FIND_INT( *table, &input[i], e);
    //printf("encoding i: %d -> %u -> ", i ,input[i]);
    ts = e->size;

    f = (unsigned char *) &e->code;

    for(k=0; k < ts; k++) {
      //printf("%u ", *f);
      *(t++) = *(f++);
    }
    //printf("\n");
    /*
    int t;
    printf("%u ->", input[i]);
    for(t=0; t<ts; t++) printf(" %u", output[j+t]);
    printf("\n");
    */

  }
  return (t - output);
}